

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O1

wchar_t * cmsysEncoding_DupToWide(char *str)

{
  size_t sVar1;
  wchar_t *__pwcs;
  
  if (str == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = mbstowcs((wchar_t *)0x0,str,0);
    sVar1 = sVar1 + 1;
  }
  if ((sVar1 != 0) && (__pwcs = (wchar_t *)malloc(sVar1 * 4), __pwcs != (wchar_t *)0x0)) {
    *__pwcs = L'\0';
    if (str == (char *)0x0) {
      return __pwcs;
    }
    mbstowcs(__pwcs,str,sVar1);
    return __pwcs;
  }
  return (wchar_t *)0x0;
}

Assistant:

wchar_t* kwsysEncoding_DupToWide(const char* str)
{
  wchar_t* ret = NULL;
  size_t length = kwsysEncoding_mbstowcs(NULL, str, 0) + 1;
  if(length > 0)
    {
    ret = (wchar_t*)malloc((length)*sizeof(wchar_t));
    if(ret)
      {
      ret[0] = 0;
      kwsysEncoding_mbstowcs(ret, str, length);
      }
    }
  return ret;
}